

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

bool __thiscall Func::IsAggressiveIntTypeSpecDisabled(Func *this)

{
  bool bVar1;
  JITTimeProfileInfo *this_00;
  Func *this_local;
  
  bVar1 = HasProfileInfo(this);
  if (bVar1) {
    this_00 = GetReadOnlyProfileInfo(this);
    bVar1 = IsLoopBody(this);
    bVar1 = JITTimeProfileInfo::IsAggressiveIntTypeSpecDisabled(this_00,bVar1);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = JITOutput::IsAggressiveIntTypeSpecDisabled(&this->m_output);
  return bVar1;
}

Assistant:

bool
Func::IsAggressiveIntTypeSpecDisabled() const
{
    return (HasProfileInfo() && GetReadOnlyProfileInfo()->IsAggressiveIntTypeSpecDisabled(IsLoopBody())) || m_output.IsAggressiveIntTypeSpecDisabled();
}